

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * __thiscall
google::protobuf::(anonymous_namespace)::ToJsonName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view input)

{
  bool bVar1;
  difference_type __n;
  long lVar2;
  Nonnull<const_char_*> failure_msg;
  bool bVar3;
  _anonymous_namespace_ *p_Var4;
  LogMessageFatal local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (this == (_anonymous_namespace_ *)0x0) {
    lVar2 = 0;
  }
  else {
    p_Var4 = (_anonymous_namespace_ *)0x0;
    bVar3 = false;
    do {
      bVar1 = true;
      if (p_Var4[input._M_len] != (_anonymous_namespace_)0x5f) {
        if (bVar3) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          bVar1 = false;
        }
        else {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          bVar1 = bVar3;
        }
      }
      bVar3 = bVar1;
      p_Var4 = p_Var4 + 1;
    } while (this != p_Var4);
    p_Var4 = (_anonymous_namespace_ *)0x0;
    lVar2 = 0;
    do {
      lVar2 = lVar2 + (ulong)(p_Var4[input._M_len] == (_anonymous_namespace_)0x5f);
      p_Var4 = p_Var4 + 1;
    } while (this != p_Var4);
  }
  if ((long)this - lVar2 == __return_storage_ptr__->_M_string_length) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                            ((long)this - lVar2,__return_storage_ptr__->_M_string_length,
                             "JsonNameSize(input) == result.size()");
  }
  if (failure_msg != (Nonnull<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x98,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToJsonName(const absl::string_view input) {
  bool capitalize_next = false;
  std::string result;
  result.reserve(input.size());

  for (char character : input) {
    if (character == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(absl::ascii_toupper(character));
      capitalize_next = false;
    } else {
      result.push_back(character);
    }
  }

  ABSL_DCHECK_EQ(JsonNameSize(input), result.size());

  return result;
}